

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_EnsureNonQuadraticAsInRust_Test::TestBody
          (Table_EnsureNonQuadraticAsInRust_Test *this)

{
  bool bVar1;
  iterator iVar2;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
  local_e8;
  reference local_d0;
  long *entry;
  iterator __end2;
  iterator __begin2;
  IntTable *__range2;
  IntTable t2;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
  local_60;
  unsigned_long local_48;
  size_t i;
  IntTable t;
  Table_EnsureNonQuadraticAsInRust_Test *this_local;
  
  t.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
        )(_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          )this;
  IntTable::IntTable((IntTable *)&i);
  for (local_48 = 0; local_48 != 0x8000; local_48 = local_48 + 1) {
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::insert<unsigned_long,_0,_0>
              (&local_60,
               (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                *)&i,&local_48);
  }
  IntTable::IntTable((IntTable *)&__range2);
  iVar2 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          ::begin((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                   *)&i);
  __end2.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)iVar2.ctrl_;
  iVar2 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          ::end((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                 *)&i);
  while( true ) {
    __end2.ctrl_ = (ctrl_t *)iVar2.field_1;
    entry = (long *)iVar2.ctrl_;
    bVar1 = priv::operator!=((iterator *)&__end2.field_1,(iterator *)&entry);
    if (!bVar1) break;
    local_d0 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               ::iterator::operator*((iterator *)&__end2.field_1);
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::insert<long,_0,_0>
              (&local_e8,
               (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                *)&__range2,local_d0);
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::iterator::operator++((iterator *)&__end2.field_1);
    iVar2.field_1.slot_ = (slot_type *)__end2.ctrl_;
    iVar2.ctrl_ = (ctrl_t *)entry;
  }
  IntTable::~IntTable((IntTable *)&__range2);
  IntTable::~IntTable((IntTable *)&i);
  return;
}

Assistant:

TEST(Table, EnsureNonQuadraticAsInRust) {
  static const size_t kLargeSize = 1 << 15;

  IntTable t;
  for (size_t i = 0; i != kLargeSize; ++i) {
    t.insert(i);
  }

  // If this is quadratic, the test will timeout.
  IntTable t2;
  for (const auto& entry : t) t2.insert(entry);
}